

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

bool CommaSeparateAndAddOccurrence
               (Option *Handler,uint pos,StringRef ArgName,StringRef Value,bool MultiArg)

{
  int iVar1;
  void *pvVar2;
  ulong __n;
  ulong uVar3;
  char *__s;
  ulong uStackY_50;
  
  __n = Value.Length;
  __s = Value.Data;
  if ((Handler->field_0xd & 2) != 0) {
    if ((__n == 0) || (pvVar2 = memchr(__s,0x2c,__n), pvVar2 == (void *)0x0)) {
      uStackY_50 = 0xffffffffffffffff;
    }
    else {
      uStackY_50 = (long)pvVar2 - (long)__s;
    }
LAB_00140143:
    if (uStackY_50 != 0xffffffffffffffff) {
      uVar3 = uStackY_50;
      if (__n < uStackY_50) {
        uVar3 = __n;
      }
      iVar1 = (*Handler->_vptr_Option[10])
                        (Handler,pos,ArgName.Data,ArgName.Length,__s,uVar3,(uint)MultiArg);
      if ((char)iVar1 != '\0') {
        return true;
      }
      uVar3 = uStackY_50 + 1;
      if (__n < uStackY_50 + 1) {
        uVar3 = __n;
      }
      __s = __s + uVar3;
      __n = __n - uVar3;
      if (__n != 0) goto code_r0x00140186;
      goto LAB_0014019f;
    }
  }
  iVar1 = (*Handler->_vptr_Option[10])(Handler,pos,ArgName.Data,ArgName.Length,__s,__n);
  return SUB41(iVar1,0);
code_r0x00140186:
  pvVar2 = memchr(__s,0x2c,__n);
  uStackY_50 = (long)pvVar2 - (long)__s;
  if (pvVar2 == (void *)0x0) {
LAB_0014019f:
    uStackY_50 = 0xffffffffffffffff;
  }
  goto LAB_00140143;
}

Assistant:

static bool CommaSeparateAndAddOccurrence(Option *Handler, unsigned pos,
                                          StringRef ArgName, StringRef Value,
                                          bool MultiArg = false) {
  // Check to see if this option accepts a comma separated list of values.  If
  // it does, we have to split up the value into multiple values.
  if (Handler->getMiscFlags() & CommaSeparated) {
    StringRef Val(Value);
    StringRef::size_type Pos = Val.find(',');

    while (Pos != StringRef::npos) {
      // Process the portion before the comma.
      if (Handler->addOccurrence(pos, ArgName, Val.substr(0, Pos), MultiArg))
        return true;
      // Erase the portion before the comma, AND the comma.
      Val = Val.substr(Pos + 1);
      // Check for another comma.
      Pos = Val.find(',');
    }

    Value = Val;
  }

  return Handler->addOccurrence(pos, ArgName, Value, MultiArg);
}